

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

void __thiscall kj::UnixEventPort::ChildSet::checkExits(ChildSet *this)

{
  PromiseFulfiller<int> *pPVar1;
  bool bVar2;
  pointer ppVar3;
  _Self local_60;
  _Self local_58;
  iterator iter;
  Fault local_40;
  Fault f;
  undefined1 auStack_30 [4];
  int error;
  int *local_28;
  int local_1c;
  int local_18;
  int _kjSyscallError;
  pid_t pid;
  int status;
  ChildSet *this_local;
  
  _pid = this;
  while( true ) {
    _auStack_30 = &local_18;
    local_28 = &_kjSyscallError;
    f.exception._4_4_ =
         kj::_::Debug::syscallError<kj::UnixEventPort::ChildSet::checkExits()::__0>
                   ((anon_class_16_2_348b587e *)auStack_30,false);
    local_1c = f.exception._4_4_;
    if (f.exception._4_4_ != 0) {
      if (f.exception._4_4_ == 10) {
        return;
      }
      kj::_::Debug::Fault::Fault
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                 ,0x113,f.exception._4_4_,"waitpid()","");
      kj::_::Debug::Fault::fatal(&local_40);
    }
    if (local_18 == 0) break;
    local_58._M_node =
         (_Base_ptr)
         std::
         map<int,_kj::UnixEventPort::ChildExitPromiseAdapter_*,_std::less<int>,_std::allocator<std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>_>_>
         ::find(&this->waiters,&local_18);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<int,_kj::UnixEventPort::ChildExitPromiseAdapter_*,_std::less<int>,_std::allocator<std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>_>_>
         ::end(&this->waiters);
    bVar2 = std::operator==(&local_58,&local_60);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>_>
               ::operator->(&local_58);
      Maybe<int>::operator=(ppVar3->second->pidRef);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_int,_kj::UnixEventPort::ChildExitPromiseAdapter_*>_>
               ::operator->(&local_58);
      pPVar1 = ppVar3->second->fulfiller;
      cp<int>(&_kjSyscallError);
      (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])();
    }
  }
  return;
}

Assistant:

void UnixEventPort::ChildSet::checkExits() {
  for (;;) {
    int status;
    pid_t pid;
    KJ_SYSCALL_HANDLE_ERRORS(pid = waitpid(-1, &status, WNOHANG)) {
      case ECHILD:
        return;
      default:
        KJ_FAIL_SYSCALL("waitpid()", error);
    }
    if (pid == 0) break;

    auto iter = waiters.find(pid);
    if (iter != waiters.end()) {
      iter->second->pidRef = kj::none;
      iter->second->fulfiller.fulfill(kj::cp(status));
    }
  }
}